

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

void __thiscall Rml::ElementHandle::ElementHandle(ElementHandle *this,String *tag)

{
  Property local_60;
  
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementHandle_003979f0;
  (this->edge_margin)._M_elems[0].number = 0.0;
  (this->edge_margin)._M_elems[0].unit = UNKNOWN;
  (this->edge_margin)._M_elems[1].number = 0.0;
  (this->edge_margin)._M_elems[1].unit = UNKNOWN;
  (this->edge_margin)._M_elems[2].number = 0.0;
  (this->edge_margin)._M_elems[2].unit = UNKNOWN;
  (this->edge_margin)._M_elems[3].number = 0.0;
  (this->edge_margin)._M_elems[3].unit = UNKNOWN;
  (this->drag_start).x = 0.0;
  (this->drag_start).y = 0.0;
  (this->drag_delta_min).x = 0.0;
  (this->drag_delta_min).y = 0.0;
  (this->drag_delta_max).x = 0.0;
  (this->drag_delta_max).y = 0.0;
  (this->move_data).original_position_top_left.x = 0.0;
  (this->move_data).original_position_top_left.y = 0.0;
  (this->move_data).original_position_bottom_right.x = 0.0;
  (this->move_data).original_position_bottom_right.y = 0.0;
  *(undefined8 *)&(this->move_data).top_left = 0;
  *(undefined8 *)&(this->size_data).original_size.y = 0;
  *(undefined8 *)&(this->size_data).original_position_bottom_right.y = 0;
  Property::Property<Rml::Style::Drag,Rml::Style::Drag>(&local_60,Drag);
  Element::SetProperty(&this->super_Element,Drag,&local_60);
  Property::~Property(&local_60);
  this->initialised = false;
  this->move_target = (Element *)0x0;
  this->size_target = (Element *)0x0;
  return;
}

Assistant:

ElementHandle::ElementHandle(const String& tag) : Element(tag), drag_start(0, 0)
{
	// Make sure we can be dragged!
	SetProperty(PropertyId::Drag, Property(Style::Drag::Drag));

	move_target = nullptr;
	size_target = nullptr;
	initialised = false;
}